

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void aom_dc_predictor_32x16_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  undefined8 in_XMM0_Qa;
  undefined8 uVar5;
  undefined8 in_XMM0_Qb;
  undefined8 uVar6;
  __m256i row;
  uint16_t sum;
  __m128i left_sum;
  __m128i top_sum;
  uint8_t *in_stack_fffffffffffffee0;
  undefined2 in_stack_fffffffffffffeec;
  byte bVar7;
  undefined8 uStack_68;
  
  dc_sum_32_sse2(in_RDX);
  uVar5 = in_XMM0_Qa;
  uVar6 = in_XMM0_Qb;
  dc_sum_16_sse2(in_RCX);
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = in_XMM0_Qa;
  auVar1._8_8_ = uVar6;
  auVar1._0_8_ = uVar5;
  auVar1 = vpaddw_avx(auVar2,auVar1);
  lVar4 = (ulong)(ushort)(auVar1._0_2_ + 0x18) * 0x5555556;
  bVar7 = (byte)((ulong)lVar4 >> 0x20);
  auVar2 = vpinsrb_avx(ZEXT116(bVar7),(uint)bVar7,1);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar7,2);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar7,3);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar7,4);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar7,5);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar7,6);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar7,7);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar7,8);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar7,9);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar7,10);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar7,0xb);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar7,0xc);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar7,0xd);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar7,0xe);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar7,0xf);
  auVar3 = vpinsrb_avx(ZEXT116(bVar7),(uint)bVar7,1);
  auVar3 = vpinsrb_avx(auVar3,(uint)bVar7,2);
  auVar3 = vpinsrb_avx(auVar3,(uint)bVar7,3);
  auVar3 = vpinsrb_avx(auVar3,(uint)bVar7,4);
  auVar3 = vpinsrb_avx(auVar3,(uint)bVar7,5);
  auVar3 = vpinsrb_avx(auVar3,(uint)bVar7,6);
  auVar3 = vpinsrb_avx(auVar3,(uint)bVar7,7);
  auVar3 = vpinsrb_avx(auVar3,(uint)bVar7,8);
  auVar3 = vpinsrb_avx(auVar3,(uint)bVar7,9);
  auVar3 = vpinsrb_avx(auVar3,(uint)bVar7,10);
  auVar3 = vpinsrb_avx(auVar3,(uint)bVar7,0xb);
  auVar3 = vpinsrb_avx(auVar3,(uint)bVar7,0xc);
  auVar3 = vpinsrb_avx(auVar3,(uint)bVar7,0xd);
  auVar3 = vpinsrb_avx(auVar3,(uint)bVar7,0xe);
  vpinsrb_avx(auVar3,(uint)bVar7,0xf);
  uStack_68 = SUB168(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2,8);
  row_store_32xh(auVar1._0_8_,CONCAT22((short)((ulong)lVar4 >> 0x20),in_stack_fffffffffffffeec),
                 in_stack_fffffffffffffee0,uStack_68);
  return;
}

Assistant:

void aom_dc_predictor_32x16_avx2(uint8_t *dst, ptrdiff_t stride,
                                 const uint8_t *above, const uint8_t *left) {
  const __m128i top_sum = dc_sum_32_sse2(above);
  __m128i left_sum = dc_sum_16_sse2(left);
  left_sum = _mm_add_epi16(top_sum, left_sum);
  uint16_t sum = (uint16_t)_mm_cvtsi128_si32(left_sum);
  sum += 24;
  sum /= 48;
  const __m256i row = _mm256_set1_epi8((int8_t)sum);
  row_store_32xh(&row, 16, dst, stride);
}